

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanimationgroup.cpp
# Opt level: O2

void __thiscall
QAnimationGroup::insertAnimation(QAnimationGroup *this,int index,QAbstractAnimation *animation)

{
  long *plVar1;
  P _b;
  QAnimationGroup *this_00;
  P _a;
  ulong i;
  long in_FS_OFFSET;
  QMessageLogger local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < index) {
    plVar1 = *(long **)(this + 8);
    i = (ulong)(uint)index;
    if (i <= (ulong)plVar1[0x16]) {
      this_00 = (QAnimationGroup *)QAbstractAnimation::group((QAbstractAnimation *)animation);
      if (this_00 != (QAnimationGroup *)0x0) {
        removeAnimation(this_00,animation);
        if ((ulong)plVar1[0x16] < i) {
          i = plVar1[0x16];
        }
      }
      QList<QAbstractAnimation_*>::insert
                ((QList<QAbstractAnimation_*> *)(plVar1 + 0x14),i,animation);
      (animation->super_QObject).d_ptr.d[1].bindingStorage.bindingStatus = (QBindingStatus *)this;
      QObject::setParent(&animation->super_QObject,(QObject *)this);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        (**(code **)(*plVar1 + 0x20))(plVar1,i);
        return;
      }
      goto LAB_00365b6d;
    }
  }
  local_50.context.version = 2;
  local_50.context.function._4_4_ = 0;
  local_50.context._4_8_ = 0;
  local_50.context._12_8_ = 0;
  local_50.context.category = "default";
  QMessageLogger::warning(&local_50,"QAnimationGroup::insertAnimation: index is out of bounds");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00365b6d:
  __stack_chk_fail();
}

Assistant:

void QAnimationGroup::insertAnimation(int index, QAbstractAnimation *animation)
{
    Q_D(QAnimationGroup);

    if (index < 0 || index > d->animations.size()) {
        qWarning("QAnimationGroup::insertAnimation: index is out of bounds");
        return;
    }

    if (QAnimationGroup *oldGroup = animation->group()) {
        oldGroup->removeAnimation(animation);
        // ensure we don't insert out of bounds if oldGroup == this
        index = qMin(index, d->animations.size());
    }

    d->animations.insert(index, animation);
    QAbstractAnimationPrivate::get(animation)->group = this;
    // this will make sure that ChildAdded event is sent to 'this'
    animation->setParent(this);
    d->animationInsertedAt(index);
}